

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O0

void __thiscall
QtPrivate::QCommonArrayOps<QCss::StyleSheet>::growAppend
          (QCommonArrayOps<QCss::StyleSheet> *this,StyleSheet *b,StyleSheet *e)

{
  long lVar1;
  bool bVar2;
  StyleSheet *e_00;
  StyleSheet *in_RDX;
  StyleSheet *in_RSI;
  QGenericArrayOps<QCss::StyleSheet> *in_RDI;
  long in_FS_OFFSET;
  qsizetype n;
  DataPointer old;
  QCommonArrayOps<QCss::StyleSheet> *c;
  GrowthPosition where;
  StyleSheet *this_00;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (in_RSI != in_RDX) {
    e_00 = (StyleSheet *)(((long)in_RDX - (long)in_RSI) / 0xa0);
    c = (QCommonArrayOps<QCss::StyleSheet> *)&DAT_aaaaaaaaaaaaaaaa;
    this_00 = (StyleSheet *)&DAT_aaaaaaaaaaaaaaaa;
    QArrayDataPointer<QCss::StyleSheet>::QArrayDataPointer
              ((QArrayDataPointer<QCss::StyleSheet> *)&stack0xffffffffffffffd8);
    bVar2 = q_points_into_range<QtPrivate::QCommonArrayOps<QCss::StyleSheet>,QCss::StyleSheet_const*>
                      ((StyleSheet **)this_00,c);
    where = (GrowthPosition)((ulong)c >> 0x20);
    if (bVar2) {
      QArrayDataPointer<QCss::StyleSheet>::detachAndGrow
                ((QArrayDataPointer<QCss::StyleSheet> *)this_00,where,(qsizetype)in_RDI,
                 (StyleSheet **)in_RDX,(QArrayDataPointer<QCss::StyleSheet> *)e_00);
    }
    else {
      QArrayDataPointer<QCss::StyleSheet>::detachAndGrow
                ((QArrayDataPointer<QCss::StyleSheet> *)this_00,where,(qsizetype)in_RDI,
                 (StyleSheet **)in_RDX,(QArrayDataPointer<QCss::StyleSheet> *)e_00);
    }
    QGenericArrayOps<QCss::StyleSheet>::copyAppend(in_RDI,in_RDX,e_00);
    QArrayDataPointer<QCss::StyleSheet>::~QArrayDataPointer
              ((QArrayDataPointer<QCss::StyleSheet> *)e_00);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void growAppend(const T *b, const T *e)
    {
        if (b == e)
            return;
        Q_ASSERT(b < e);
        const qsizetype n = e - b;
        DataPointer old;

        // points into range:
        if (QtPrivate::q_points_into_range(b, *this))
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, &b, &old);
        else
            this->detachAndGrow(QArrayData::GrowsAtEnd, n, nullptr, nullptr);
        Q_ASSERT(this->freeSpaceAtEnd() >= n);
        // b might be updated so use [b, n)
        this->copyAppend(b, b + n);
    }